

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

char * __thiscall masksearch::search(masksearch *this,char *first,char *last,CallbackType *cb)

{
  pointer ppVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  char *p;
  char *pcVar5;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *bm;
  pointer ppVar6;
  
  ppVar6 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->patterns).
           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar6 == ppVar1) {
      return last;
    }
    puVar2 = (ppVar6->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (ppVar6->first).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar5 = first;
    while ((pcVar5 != last &&
           (pcVar5 = pcVar5 + ((long)(ppVar6->first).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                              (long)(ppVar6->first).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), pcVar5 != last))) {
      bVar4 = std::function<bool_(const_char_*,_const_char_*)>::operator()
                        (cb,pcVar5,pcVar5 + ((long)puVar2 - (long)puVar3));
      pcVar5 = pcVar5 + 1;
      if (!bVar4) {
        return (char *)0x0;
      }
    }
    ppVar6 = ppVar6 + 1;
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        for (auto& bm : patterns)
        {
            auto size = bm.first.size();

            auto p = first;
            while (p != last) {
                auto f = maskedsearch(p, last, bm);
                if (f == last)
                    break;
                if (!cb((const char*)f, (const char*)f + size))
                    return NULL;
                p = f + 1;
            }
        }
        return last;
    }